

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wfc.hpp
# Opt level: O2

Array2D<Color> * __thiscall
TilingWFC<Color>::id_to_tiling
          (Array2D<Color> *__return_storage_ptr__,TilingWFC<Color> *this,Array2D<unsigned_int> *ids)

{
  undefined2 uVar1;
  int iVar2;
  uint uVar3;
  pointer ppVar4;
  long lVar5;
  long lVar6;
  pointer pCVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  long lVar12;
  uint y;
  int iVar13;
  int iVar14;
  uint x;
  int iVar15;
  int local_40;
  
  iVar2 = **(int **)&(((this->tiles).super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>.
                       _M_impl.super__Vector_impl_data._M_start)->data).
                     super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>;
  Array2D<Color>::Array2D(__return_storage_ptr__,ids->height * iVar2,ids->width * iVar2);
  local_40 = 0;
  for (uVar9 = 0; uVar9 < ids->height; uVar9 = uVar9 + 1) {
    iVar10 = 0;
    for (uVar11 = 0; uVar11 < ids->width; uVar11 = uVar11 + 1) {
      uVar8 = (ids->data).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[ids->width * uVar9 + uVar11];
      ppVar4 = (this->id_to_oriented_tile).
               super__Vector_base<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar3 = ppVar4[uVar8].first;
      lVar12 = (ulong)ppVar4[uVar8].second * 0x20;
      iVar14 = local_40;
      for (iVar13 = 0; iVar13 != iVar2; iVar13 = iVar13 + 1) {
        for (iVar15 = 0; iVar2 != iVar15; iVar15 = iVar15 + 1) {
          lVar5 = *(long *)&(this->tiles).
                            super__Vector_base<Tile<Color>,_std::allocator<Tile<Color>_>_>._M_impl.
                            super__Vector_impl_data._M_start[uVar3].data.
                            super__Vector_base<Array2D<Color>,_std::allocator<Array2D<Color>_>_>;
          lVar6 = *(long *)(lVar5 + 8 + lVar12);
          lVar5 = (ulong)(uint)(*(int *)(lVar5 + 4 + lVar12) * iVar13 + iVar15) * 3;
          uVar8 = __return_storage_ptr__->width * iVar14 + iVar10 + iVar15;
          pCVar7 = (__return_storage_ptr__->data).super__Vector_base<Color,_std::allocator<Color>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pCVar7[uVar8].b = *(uchar *)(lVar6 + 2 + lVar5);
          uVar1 = *(undefined2 *)(lVar6 + lVar5);
          pCVar7 = pCVar7 + uVar8;
          pCVar7->r = (char)uVar1;
          pCVar7->g = (char)((ushort)uVar1 >> 8);
        }
        iVar14 = iVar14 + 1;
      }
      iVar10 = iVar10 + iVar2;
    }
    local_40 = local_40 + iVar2;
  }
  return __return_storage_ptr__;
}

Assistant:

Array2D<T> id_to_tiling(Array2D<unsigned> ids) {
		unsigned size = tiles[0].data[0].height;
		Array2D<T> tiling(size * ids.height, size * ids.width);
		for (unsigned i = 0; i < ids.height; i++) {
			for (unsigned j = 0; j < ids.width; j++) {
				std::pair<unsigned, unsigned> oriented_tile =
					id_to_oriented_tile[ids.get(i, j)];
				for (unsigned y = 0; y < size; y++) {
					for (unsigned x = 0; x < size; x++) {
						tiling.get(i * size + y, j * size + x) =
							tiles[oriented_tile.first].data[oriented_tile.second].get(y, x);
					}
				}
			}
		}
		return tiling;
	}